

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O0

void __thiscall TimerTest_scoped_Test::~TimerTest_scoped_Test(TimerTest_scoped_Test *this)

{
  TimerTest_scoped_Test *this_local;
  
  ~TimerTest_scoped_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TimerTest, scoped) {
	size_t iterations{ 0 };
	std::promise<void> promise;

	timer timer_obj{ period, [&iterations, &promise, &timer_obj](timer& in_timer) {
		EXPECT_EQ(timer_obj, in_timer);

		if (++iterations == total_iterations) {
			promise.set_value();
			in_timer.cancel();
		}
	} };

	EXPECT_EQ(promise.get_future().wait_for(timeout * 100000), std::future_status::ready);
}